

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pBox)

{
  Abc_Ntk_t *pNtk;
  long *plVar1;
  Abc_Obj_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if ((*(uint *)&pBox->field_0x14 & 0xf) != 10 && (*(uint *)&pBox->field_0x14 & 0xe) != 8) {
    __assert_fail("Abc_ObjIsBox(pBox)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLib.c"
                  ,0x174,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pNtk = (Abc_Ntk_t *)(pBox->field_5).pData;
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    if (pNtk->nObjCounts[8] == 0) {
      pAVar2 = pBox->pNext;
      Abc_NtkCleanCopy(pNtk);
      uVar4 = 0;
      while( true ) {
        if ((long)pNtk->vPis->nSize <= (long)uVar4) break;
        plVar1 = (long *)Vec_PtrEntry(pNtk->vPis,(uint)uVar4);
        if (pAVar2 == (Abc_Obj_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)((*(uint *)((long)&pAVar2->pNtk + (uVar4 >> 5 & 0x7ffffff) * 4) >>
                           ((uint)uVar4 & 0x1f) & 1) != 0);
        }
        uVar3 = uVar3 ^ *(ulong *)((long)pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[uVar4]] +
                                  0x40);
        plVar1[8] = uVar3;
        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8)
                  + 0x40) = uVar3;
        uVar4 = uVar4 + 1;
      }
      for (lVar5 = 0; lVar5 < pNtk->vPos->nSize; lVar5 = lVar5 + 1) {
        plVar1 = (long *)Vec_PtrEntry(pNtk->vPos,(int)lVar5);
        pAVar2 = Abc_ObjFanin0Ntk(*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)plVar1[4] * 8));
        Abc_NodeStrashUsingNetwork_rec(pNtkAig,pAVar2);
        *(undefined8 *)((long)pBox->pNtk->vObjs->pArray[(pBox->vFanouts).pArray[lVar5]] + 0x40) =
             *(undefined8 *)
              (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8) +
              0x40);
      }
      return;
    }
    __assert_fail("Abc_NtkLatchNum(pNtkGate) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLib.c"
                  ,0x178,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  __assert_fail("Abc_NtkIsNetlist(pNtkGate)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLib.c"
                ,0x177,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_NodeStrashUsingNetwork( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pBox )
{ 
    Abc_Ntk_t * pNtkGate;
    Abc_Obj_t * pObj;
    unsigned * pPolarity;
    int i, fCompl;
    assert( Abc_ObjIsBox(pBox) );
    pNtkGate = (Abc_Ntk_t *)pBox->pData;
    pPolarity = (unsigned *)pBox->pNext;
    assert( Abc_NtkIsNetlist(pNtkGate) );
    assert( Abc_NtkLatchNum(pNtkGate) == 0 );
    Abc_NtkCleanCopy( pNtkGate );
    // set the PI values
    Abc_NtkForEachPi( pNtkGate, pObj, i )
    {
        fCompl = (pPolarity && Abc_InfoHasBit(pPolarity, i));
        pObj->pCopy = Abc_ObjNotCond( Abc_ObjFanin(pBox,i)->pCopy, fCompl );
        Abc_ObjFanout0(pObj)->pCopy = pObj->pCopy;
    }
    // build recursively and set the PO values
    Abc_NtkForEachPo( pNtkGate, pObj, i )
    {
        Abc_NodeStrashUsingNetwork_rec( pNtkAig, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)) );
        Abc_ObjFanout(pBox,i)->pCopy = Abc_ObjFanin0(pObj)->pCopy;
    }
//printf( "processing %d\n", pBox->Id );
}